

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daily_file_sink.h
# Opt level: O0

void __thiscall
spdlog::sinks::
daily_file_sink<spdlog::details::null_mutex,_spdlog::sinks::daily_filename_calculator>::
daily_file_sink(daily_file_sink<spdlog::details::null_mutex,_spdlog::sinks::daily_filename_calculator>
                *this,filename_t *base_filename,int rotation_hour,int rotation_minute,bool truncate,
               uint16_t max_files,file_event_handlers *event_handlers)

{
  time_point tVar1;
  byte bVar2;
  int in_ECX;
  int in_EDX;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined4 in_R8D;
  undefined2 in_R9W;
  daily_file_sink<spdlog::details::null_mutex,_spdlog::sinks::daily_filename_calculator>
  *in_stack_00000010;
  filename_t filename;
  time_point now;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffef0;
  daily_file_sink<spdlog::details::null_mutex,_spdlog::sinks::daily_filename_calculator>
  *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  daily_file_sink<spdlog::details::null_mutex,_spdlog::sinks::daily_filename_calculator>
  *in_stack_ffffffffffffff48;
  string local_80 [32];
  undefined8 local_60;
  tm *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe6;
  
  bVar2 = (byte)in_R8D & 1;
  base_sink<spdlog::details::null_mutex>::base_sink
            ((base_sink<spdlog::details::null_mutex> *)CONCAT44(in_R8D,in_stack_ffffffffffffff10));
  *(undefined ***)in_RDI = &PTR__daily_file_sink_002cdaf0;
  this_00 = in_RDI + 1;
  std::__cxx11::string::string((string *)this_00,in_RSI);
  *(int *)(in_RDI + 2) = in_EDX;
  *(int *)&in_RDI[2].field_0x4 = in_ECX;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(in_stack_fffffffffffffef0);
  details::file_helper::file_helper
            ((file_helper *)CONCAT44(in_R8D,in_stack_ffffffffffffff10),
             (file_event_handlers *)&in_RDI[2].field_2);
  in_RDI[8]._M_dataplus = (_Alloc_hider)(bVar2 & 1);
  *(undefined2 *)&in_RDI[8].field_0x2 = in_R9W;
  tVar1.__d.__r = (duration)&in_RDI[8]._M_string_length;
  memset((void *)tVar1.__d.__r,0,0x38);
  details::
  circular_q<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  circular_q((circular_q<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1eaa6a);
  if ((((-1 < in_EDX) && (in_EDX < 0x18)) && (-1 < in_ECX)) && (in_ECX < 0x3c)) {
    local_60 = std::chrono::_V2::system_clock::now();
    now_tm(in_stack_fffffffffffffef8,tVar1);
    daily_filename_calculator::calc_filename
              ((filename_t *)
               CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffffe6,
                                       CONCAT24(in_R9W,in_stack_ffffffffffffffe0))),
               in_stack_ffffffffffffffd8);
    details::file_helper::open
              ((file_helper *)&in_RDI[2].field_2,(char *)local_80,(byte)in_RDI[8]._M_dataplus & 1);
    tVar1 = next_rotation_tp_(in_stack_ffffffffffffff48);
    in_RDI[2]._M_string_length = (size_type)tVar1.__d.__r;
    if (*(short *)&in_RDI[8].field_0x2 != 0) {
      init_filenames_q_(in_stack_00000010);
    }
    std::__cxx11::string::~string(local_80);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDI,(char *)this_00,(allocator<char> *)in_RSI);
  throw_spdlog_ex(in_RDI);
}

Assistant:

daily_file_sink(filename_t base_filename, int rotation_hour, int rotation_minute, bool truncate = false, uint16_t max_files = 0,
        const file_event_handlers &event_handlers = {})
        : base_filename_(std::move(base_filename))
        , rotation_h_(rotation_hour)
        , rotation_m_(rotation_minute)
        , file_helper_{event_handlers}
        , truncate_(truncate)
        , max_files_(max_files)
        , filenames_q_()
    {
        if (rotation_hour < 0 || rotation_hour > 23 || rotation_minute < 0 || rotation_minute > 59)
        {
            throw_spdlog_ex("daily_file_sink: Invalid rotation time in ctor");
        }

        auto now = log_clock::now();
        auto filename = FileNameCalc::calc_filename(base_filename_, now_tm(now));
        file_helper_.open(filename, truncate_);
        rotation_tp_ = next_rotation_tp_();

        if (max_files_ > 0)
        {
            init_filenames_q_();
        }
    }